

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSeparateArgumentsCommand.cxx
# Opt level: O1

bool __thiscall
cmSeparateArgumentsCommand::InitialPass
          (cmSeparateArgumentsCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *__s;
  size_t sVar7;
  size_type sVar8;
  byte bVar9;
  ulong uVar10;
  char cVar11;
  string *vi;
  _Alloc_hider _Var12;
  long lVar13;
  int iVar14;
  pointer pbVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  string var;
  string command;
  ostringstream e;
  string local_218;
  string local_1f0;
  char *local_1d0;
  undefined8 local_1c8;
  char local_1c0;
  undefined7 uStack_1bf;
  ulong local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  pbVar15 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar15 == pbVar1) {
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"must be given at least one argument.","");
    cmCommand::SetError(&this->super_cmCommand,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,
                      CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                               local_1a8[0].field_2._M_local_buf[0]) + 1);
    }
    bVar9 = 0;
  }
  else {
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    uVar10 = 0;
    local_1f0._M_string_length = 0;
    local_1f0.field_2._M_local_buf[0] = '\0';
    local_1d0 = &local_1c0;
    local_1c8 = 0;
    local_1c0 = '\0';
    iVar14 = 1;
    iVar5 = 0;
    do {
      if (iVar14 == 3) {
        std::__cxx11::string::_M_assign((string *)&local_1d0);
        iVar14 = 0;
LAB_002f9aa2:
        bVar4 = true;
      }
      else if (iVar14 == 2) {
        iVar6 = std::__cxx11::string::compare((char *)pbVar15);
        bVar4 = true;
        if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)pbVar15), iVar6 == 0)) {
          iVar14 = 3;
          iVar5 = 1;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)pbVar15);
          if (iVar6 != 0) goto LAB_002f9a0d;
          iVar5 = 2;
          iVar14 = 3;
        }
      }
      else {
        if (iVar14 == 1) {
          std::__cxx11::string::_M_assign((string *)&local_1f0);
          iVar14 = 2;
          goto LAB_002f9aa2;
        }
LAB_002f9a0d:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"given unknown argument ",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(pbVar15->_M_dataplus)._M_p,pbVar15->_M_string_length);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar4 = false;
      }
      if (!bVar4) break;
      pbVar15 = pbVar15 + 1;
      uVar10 = (ulong)(pbVar15 == pbVar1);
    } while (pbVar15 != pbVar1);
    if (uVar10 != 0) {
      if (iVar5 == 0) {
        __s = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,&local_1f0);
        if (__s != (char *)0x0) {
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          sVar7 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s,__s + sVar7);
          if (local_1a8[0]._M_string_length != 0) {
            sVar8 = 0;
            do {
              if (local_1a8[0]._M_dataplus._M_p[sVar8] == ' ') {
                local_1a8[0]._M_dataplus._M_p[sVar8] = ';';
              }
              sVar8 = sVar8 + 1;
            } while (local_1a8[0]._M_string_length != sVar8);
          }
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,&local_1f0,local_1a8[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                                     local_1a8[0].field_2._M_local_buf[0]) + 1);
          }
        }
      }
      else {
        local_218._M_dataplus._M_p = (pointer)0x0;
        local_218._M_string_length = 0;
        local_218.field_2._M_allocated_capacity = 0;
        local_1b0 = uVar10;
        if (iVar5 == 1) {
          cmSystemTools::ParseUnixCommandLine
                    (local_1d0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_218);
        }
        else {
          cmSystemTools::ParseWindowsCommandLine
                    (local_1d0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_218);
        }
        sVar8 = local_218._M_string_length;
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        local_1a8[0]._M_string_length = 0;
        local_1a8[0].field_2._M_local_buf[0] = '\0';
        if (local_218._M_dataplus._M_p != (pointer)local_218._M_string_length) {
          _Var12._M_p = local_218._M_dataplus._M_p;
          do {
            std::__cxx11::string::append((char *)local_1a8);
            lVar2 = *(long *)((long)_Var12._M_p + 8);
            if (lVar2 != 0) {
              lVar3 = *(long *)_Var12._M_p;
              lVar13 = 0;
              do {
                cVar11 = (char)local_1a8;
                if (*(char *)(lVar3 + lVar13) == ';') {
                  std::__cxx11::string::push_back(cVar11);
                }
                std::__cxx11::string::push_back(cVar11);
                lVar13 = lVar13 + 1;
              } while (lVar2 != lVar13);
            }
            _Var12._M_p = _Var12._M_p + 0x20;
          } while (_Var12._M_p != (pointer)sVar8);
        }
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,&local_1f0,local_1a8[0]._M_dataplus._M_p);
        uVar10 = local_1b0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                                   local_1a8[0].field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_218);
      }
    }
    bVar9 = (byte)uVar10;
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,
                      CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                               local_1f0.field_2._M_local_buf[0]) + 1);
    }
  }
  return (bool)(bVar9 & 1);
}

Assistant:

bool cmSeparateArgumentsCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("must be given at least one argument.");
    return false;
  }

  std::string var;
  std::string command;
  enum Mode
  {
    ModeOld,
    ModeUnix,
    ModeWindows
  };
  Mode mode = ModeOld;
  enum Doing
  {
    DoingNone,
    DoingVariable,
    DoingMode,
    DoingCommand
  };
  Doing doing = DoingVariable;
  for (std::string const& arg : args) {
    if (doing == DoingVariable) {
      var = arg;
      doing = DoingMode;
    } else if (doing == DoingMode && arg == "NATIVE_COMMAND") {
#ifdef _WIN32
      mode = ModeWindows;
#else
      mode = ModeUnix;
#endif
      doing = DoingCommand;
    } else if (doing == DoingMode && arg == "UNIX_COMMAND") {
      mode = ModeUnix;
      doing = DoingCommand;
    } else if (doing == DoingMode && arg == "WINDOWS_COMMAND") {
      mode = ModeWindows;
      doing = DoingCommand;
    } else if (doing == DoingCommand) {
      command = arg;
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "given unknown argument " << arg;
      this->SetError(e.str());
      return false;
    }
  }

  if (mode == ModeOld) {
    // Original space-replacement version of command.
    if (const char* def = this->Makefile->GetDefinition(var)) {
      std::string value = def;
      std::replace(value.begin(), value.end(), ' ', ';');
      this->Makefile->AddDefinition(var, value.c_str());
    }
  } else {
    // Parse the command line.
    std::vector<std::string> vec;
    if (mode == ModeUnix) {
      cmSystemTools::ParseUnixCommandLine(command.c_str(), vec);
    } else // if(mode == ModeWindows)
    {
      cmSystemTools::ParseWindowsCommandLine(command.c_str(), vec);
    }

    // Construct the result list value.
    std::string value;
    const char* sep = "";
    for (std::string const& vi : vec) {
      // Separate from the previous argument.
      value += sep;
      sep = ";";

      // Preserve semicolons.
      for (char si : vi) {
        if (si == ';') {
          value += '\\';
        }
        value += si;
      }
    }
    this->Makefile->AddDefinition(var, value.c_str());
  }

  return true;
}